

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

void set_chroma_coefficient_fallback_soln(aom_equation_system_t *eqns)

{
  int iVar1;
  long *in_RDI;
  int last;
  double kTolerance;
  
  iVar1 = (int)in_RDI[3] + -1;
  memset((void *)in_RDI[2],0,(long)(int)in_RDI[3] << 3);
  if (1e-06 < ABS(*(double *)(*in_RDI + (long)(iVar1 * (int)in_RDI[3] + iVar1) * 8))) {
    *(double *)(in_RDI[2] + (long)iVar1 * 8) =
         *(double *)(in_RDI[1] + (long)iVar1 * 8) /
         *(double *)(*in_RDI + (long)(iVar1 * (int)in_RDI[3] + iVar1) * 8);
  }
  return;
}

Assistant:

static void set_chroma_coefficient_fallback_soln(aom_equation_system_t *eqns) {
  const double kTolerance = 1e-6;
  const int last = eqns->n - 1;
  // Set all of the AR coefficients to zero, but try to solve for correlation
  // with the luma channel
  memset(eqns->x, 0, sizeof(*eqns->x) * eqns->n);
  if (fabs(eqns->A[last * eqns->n + last]) > kTolerance) {
    eqns->x[last] = eqns->b[last] / eqns->A[last * eqns->n + last];
  }
}